

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_0xx9_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint uVar1;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  uVar1 = quads[1];
  if (uVar1 == 0) {
    if (quads[2] == 0) {
      sh4asm_txt_nop(em);
      return;
    }
  }
  else if (uVar1 == 1) {
    if (quads[2] == 0) {
      sh4asm_txt_div0u(em);
      return;
    }
  }
  else if (uVar1 == 2) {
    sh4asm_txt_movt_rn(em,quads[2]);
    return;
  }
  sh4asm_opcode_non_inst_(quads,em);
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_0xx9_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[1]) {
    case 0:
        // mask is 0xffff
        if (quads[2] == 0)
            sh4asm_txt_nop(em);
        else
            goto non_inst;
        break;
    case 1:
        // mask is 0xffff
        if (quads[2] == 0)
            sh4asm_txt_div0u(em);
        else
            goto non_inst;
        break;
    case 2:
        // mask is 0xf0ff
        sh4asm_txt_movt_rn(em, quads[2]);
        break;
    default:
        goto non_inst;
    }
    return;
 non_inst:
    sh4asm_opcode_non_inst_(quads, em);
}